

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

nk_vec2 nk_widget_position(nk_context *ctx)

{
  undefined1 local_28 [8];
  nk_rect bounds;
  nk_context *ctx_local;
  
  bounds._8_8_ = ctx;
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                  ,0x496e,"struct nk_vec2 nk_widget_position(struct nk_context *)");
  }
  if (ctx->current != (nk_window *)0x0) {
    if ((ctx == (nk_context *)0x0) || (ctx->current == (nk_window *)0x0)) {
      ctx_local = (nk_context *)nk_vec2(0.0,0.0);
    }
    else {
      nk_layout_peek((nk_rect *)local_28,ctx);
      ctx_local = (nk_context *)nk_vec2((float)local_28._0_4_,(float)local_28._4_4_);
    }
    return (nk_vec2)ctx_local;
  }
  __assert_fail("ctx->current",
                "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                ,0x496f,"struct nk_vec2 nk_widget_position(struct nk_context *)");
}

Assistant:

NK_API struct nk_vec2
nk_widget_position(struct nk_context *ctx)
{
    struct nk_rect bounds;
    NK_ASSERT(ctx);
    NK_ASSERT(ctx->current);
    if (!ctx || !ctx->current)
        return nk_vec2(0,0);

    nk_layout_peek(&bounds, ctx);
    return nk_vec2(bounds.x, bounds.y);
}